

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIndexTryHdr(Wal *pWal,int *pChanged)

{
  int iVar1;
  WalIndexHdr *__src;
  WalIndexHdr *aHdr;
  WalIndexHdr h2;
  WalIndexHdr h1;
  u32 aCksum [2];
  int *pChanged_local;
  Wal *pWal_local;
  
  __src = walIndexHdr(pWal);
  memcpy(h2.aCksum,__src,0x30);
  walShmBarrier(pWal);
  memcpy(&aHdr,__src + 1,0x30);
  iVar1 = memcmp(h2.aCksum,&aHdr,0x30);
  if (iVar1 == 0) {
    if ((char)h1.unused == '\0') {
      pWal_local._4_4_ = 1;
    }
    else {
      walChecksumBytes(1,(u8 *)h2.aCksum,0x28,(u32 *)0x0,h1.aCksum);
      if ((h1.aCksum[0] == h1.aSalt[0]) && (h1.aCksum[1] == h1.aSalt[1])) {
        iVar1 = memcmp(&pWal->hdr,h2.aCksum,0x30);
        if (iVar1 != 0) {
          *pChanged = 1;
          memcpy(&pWal->hdr,h2.aCksum,0x30);
          pWal->szPage = ((pWal->hdr).szPage & 0xfe00) + ((pWal->hdr).szPage & 1) * 0x10000;
        }
        pWal_local._4_4_ = 0;
      }
      else {
        pWal_local._4_4_ = 1;
      }
    }
  }
  else {
    pWal_local._4_4_ = 1;
  }
  return pWal_local._4_4_;
}

Assistant:

static int walIndexTryHdr(Wal *pWal, int *pChanged){
  u32 aCksum[2];                  /* Checksum on the header content */
  WalIndexHdr h1, h2;             /* Two copies of the header content */
  WalIndexHdr volatile *aHdr;     /* Header in shared memory */

  /* The first page of the wal-index must be mapped at this point. */
  assert( pWal->nWiData>0 && pWal->apWiData[0] );

  /* Read the header. This might happen concurrently with a write to the
  ** same area of shared memory on a different CPU in a SMP,
  ** meaning it is possible that an inconsistent snapshot is read
  ** from the file. If this happens, return non-zero.
  **
  ** There are two copies of the header at the beginning of the wal-index.
  ** When reading, read [0] first then [1].  Writes are in the reverse order.
  ** Memory barriers are used to prevent the compiler or the hardware from
  ** reordering the reads and writes.
  */
  aHdr = walIndexHdr(pWal);
  memcpy(&h1, (void *)&aHdr[0], sizeof(h1));
  walShmBarrier(pWal);
  memcpy(&h2, (void *)&aHdr[1], sizeof(h2));

  if( memcmp(&h1, &h2, sizeof(h1))!=0 ){
    return 1;   /* Dirty read */
  }  
  if( h1.isInit==0 ){
    return 1;   /* Malformed header - probably all zeros */
  }
  walChecksumBytes(1, (u8*)&h1, sizeof(h1)-sizeof(h1.aCksum), 0, aCksum);
  if( aCksum[0]!=h1.aCksum[0] || aCksum[1]!=h1.aCksum[1] ){
    return 1;   /* Checksum does not match */
  }

  if( memcmp(&pWal->hdr, &h1, sizeof(WalIndexHdr)) ){
    *pChanged = 1;
    memcpy(&pWal->hdr, &h1, sizeof(WalIndexHdr));
    pWal->szPage = (pWal->hdr.szPage&0xfe00) + ((pWal->hdr.szPage&0x0001)<<16);
    testcase( pWal->szPage<=32768 );
    testcase( pWal->szPage>=65536 );
  }

  /* The header was successfully read. Return zero. */
  return 0;
}